

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrWorldMeshBlockML *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  string type_prefix;
  string confidencebuffer_prefix;
  string confidencecount_prefix;
  string normalbuffer_prefix;
  string normalcount_prefix;
  string vertexbuffer_prefix;
  string vertexcount_prefix;
  string indexbuffer_prefix;
  string indexcount_prefix;
  string flags_prefix;
  string lod_prefix;
  string blockresult_prefix;
  string uuid_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  undefined1 local_c58 [32];
  string local_c38;
  string local_c18;
  ostringstream oss_indexCount;
  ostringstream oss_normalBuffer;
  uint auStack_a60 [88];
  ostringstream oss_vertexBuffer;
  uint auStack_8e8 [88];
  ostringstream oss_confidenceBuffer;
  undefined8 local_780 [46];
  ostringstream oss_confidenceCount;
  ostringstream oss_normalCount;
  ostringstream oss_vertexCount;
  ostringstream oss_indexBuffer;
  
  PointerToHexString<XrWorldMeshBlockML>((XrWorldMeshBlockML *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_indexCount);
  std::__cxx11::string::~string((string *)&oss_indexCount);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_indexCount,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_indexCount)
    ;
    std::__cxx11::string::~string((string *)&oss_indexCount);
  }
  else {
    _oss_indexCount = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_indexCount);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_indexCount);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_c18,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_c18,contents);
  std::__cxx11::string::~string((string *)&local_c18);
  if (bVar2) {
    std::__cxx11::string::string((string *)&uuid_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&uuid_prefix);
    std::__cxx11::string::string((string *)(local_c58 + 0x20),(string *)&uuid_prefix);
    gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_c58;
    std::__cxx11::string::string
              ((string *)gen_dispatch_table_00,"XrUuidEXT",(allocator *)&oss_indexCount);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table_00,&value->uuid,(string *)(local_c58 + 0x20),
                       (string *)local_c58,false,contents);
    std::__cxx11::string::~string((string *)local_c58);
    std::__cxx11::string::~string((string *)(local_c58 + 0x20));
    if (bVar2) {
      std::__cxx11::string::string((string *)&blockresult_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&blockresult_prefix);
      std::__cxx11::to_string((string *)&oss_indexCount,value->blockResult);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[25],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [25])"XrWorldMeshBlockResultML",&blockresult_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_indexCount);
      std::__cxx11::string::~string((string *)&oss_indexCount);
      std::__cxx11::string::string((string *)&lod_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&lod_prefix);
      std::__cxx11::to_string((string *)&oss_indexCount,value->lod);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[25],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [25])"XrWorldMeshDetectorLodML",&lod_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_indexCount);
      std::__cxx11::string::~string((string *)&oss_indexCount);
      std::__cxx11::string::string((string *)&flags_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&flags_prefix);
      std::__cxx11::to_string((string *)&oss_indexCount,value->flags);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[27],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [27])"XrWorldMeshDetectorFlagsML",&flags_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_indexCount);
      std::__cxx11::string::~string((string *)&oss_indexCount);
      std::__cxx11::string::string((string *)&indexcount_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&indexcount_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indexCount);
      poVar4 = std::operator<<((ostream *)&oss_indexCount,"0x");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [9])"uint32_t",&indexcount_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_indexBuffer);
      std::__cxx11::string::~string((string *)&oss_indexBuffer);
      std::__cxx11::string::string((string *)&indexbuffer_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&indexbuffer_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indexBuffer);
      poVar4 = std::operator<<((ostream *)&oss_indexBuffer,"0x");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(poVar4);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[10],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [10])"uint16_t*",&indexbuffer_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_vertexCount);
      std::__cxx11::string::~string((string *)&oss_vertexCount);
      std::__cxx11::string::string((string *)&vertexcount_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&vertexcount_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexCount);
      poVar4 = std::operator<<((ostream *)&oss_vertexCount,"0x");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [9])"uint32_t",&vertexcount_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_vertexBuffer);
      std::__cxx11::string::~string((string *)&oss_vertexBuffer);
      std::__cxx11::string::string((string *)&vertexbuffer_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&vertexbuffer_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexBuffer);
      *(uint *)((long)auStack_8e8 + *(long *)(_oss_vertexBuffer + -0x18)) =
           *(uint *)((long)auStack_8e8 + *(long *)(_oss_vertexBuffer + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(&oss_vertexBuffer);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [12])0x2122a1,&vertexbuffer_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_normalCount);
      std::__cxx11::string::~string((string *)&oss_normalCount);
      std::__cxx11::string::string((string *)&normalcount_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&normalcount_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_normalCount);
      poVar4 = std::operator<<((ostream *)&oss_normalCount,"0x");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [9])"uint32_t",&normalcount_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_normalBuffer);
      std::__cxx11::string::~string((string *)&oss_normalBuffer);
      std::__cxx11::string::string((string *)&normalbuffer_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&normalbuffer_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_normalBuffer);
      *(uint *)((long)auStack_a60 + *(long *)(_oss_normalBuffer + -0x18)) =
           *(uint *)((long)auStack_a60 + *(long *)(_oss_normalBuffer + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(&oss_normalBuffer);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [12])0x2122a1,&normalbuffer_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_confidenceCount);
      std::__cxx11::string::~string((string *)&oss_confidenceCount);
      std::__cxx11::string::string((string *)&confidencecount_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&confidencecount_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_confidenceCount);
      poVar4 = std::operator<<((ostream *)&oss_confidenceCount,"0x");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [9])"uint32_t",&confidencecount_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_confidenceBuffer);
      std::__cxx11::string::~string((string *)&oss_confidenceBuffer);
      std::__cxx11::string::string((string *)&confidencebuffer_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&confidencebuffer_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_confidenceBuffer);
      *(undefined8 *)((long)local_780 + *(long *)(_oss_confidenceBuffer + -0x18)) = 0x20;
      std::ostream::_M_insert<void_const*>(&oss_confidenceBuffer);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [7])0x212c5d,&confidencebuffer_prefix,&local_c78);
      std::__cxx11::string::~string((string *)&local_c78);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_confidenceBuffer);
      std::__cxx11::string::~string((string *)&confidencebuffer_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_confidenceCount);
      std::__cxx11::string::~string((string *)&confidencecount_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_normalBuffer);
      std::__cxx11::string::~string((string *)&normalbuffer_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_normalCount);
      std::__cxx11::string::~string((string *)&normalcount_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexBuffer);
      std::__cxx11::string::~string((string *)&vertexbuffer_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexCount);
      std::__cxx11::string::~string((string *)&vertexcount_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indexBuffer);
      std::__cxx11::string::~string((string *)&indexbuffer_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indexCount);
      std::__cxx11::string::~string((string *)&indexcount_prefix);
      std::__cxx11::string::~string((string *)&flags_prefix);
      std::__cxx11::string::~string((string *)&lod_prefix);
      std::__cxx11::string::~string((string *)&blockresult_prefix);
      std::__cxx11::string::~string((string *)&uuid_prefix);
      std::__cxx11::string::~string((string *)&next_prefix);
      std::__cxx11::string::~string((string *)&type_prefix);
      return true;
    }
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrWorldMeshBlockML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string uuid_prefix = prefix;
        uuid_prefix += "uuid";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->uuid, uuid_prefix, "XrUuidEXT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string blockresult_prefix = prefix;
        blockresult_prefix += "blockResult";
        contents.emplace_back("XrWorldMeshBlockResultML", blockresult_prefix, std::to_string(value->blockResult));
        std::string lod_prefix = prefix;
        lod_prefix += "lod";
        contents.emplace_back("XrWorldMeshDetectorLodML", lod_prefix, std::to_string(value->lod));
        std::string flags_prefix = prefix;
        flags_prefix += "flags";
        contents.emplace_back("XrWorldMeshDetectorFlagsML", flags_prefix, std::to_string(value->flags));
        std::string indexcount_prefix = prefix;
        indexcount_prefix += "indexCount";
        std::ostringstream oss_indexCount;
        oss_indexCount << "0x" << std::hex << (value->indexCount);
        contents.emplace_back("uint32_t", indexcount_prefix, oss_indexCount.str());
        std::string indexbuffer_prefix = prefix;
        indexbuffer_prefix += "indexBuffer";
        std::ostringstream oss_indexBuffer;
        oss_indexBuffer << "0x" << std::hex << (value->indexBuffer);
        contents.emplace_back("uint16_t*", indexbuffer_prefix, oss_indexBuffer.str());
        std::string vertexcount_prefix = prefix;
        vertexcount_prefix += "vertexCount";
        std::ostringstream oss_vertexCount;
        oss_vertexCount << "0x" << std::hex << (value->vertexCount);
        contents.emplace_back("uint32_t", vertexcount_prefix, oss_vertexCount.str());
        std::string vertexbuffer_prefix = prefix;
        vertexbuffer_prefix += "vertexBuffer";
        std::ostringstream oss_vertexBuffer;
        oss_vertexBuffer << std::hex << reinterpret_cast<const void*>(value->vertexBuffer);
        contents.emplace_back("XrVector3f*", vertexbuffer_prefix, oss_vertexBuffer.str());
        std::string normalcount_prefix = prefix;
        normalcount_prefix += "normalCount";
        std::ostringstream oss_normalCount;
        oss_normalCount << "0x" << std::hex << (value->normalCount);
        contents.emplace_back("uint32_t", normalcount_prefix, oss_normalCount.str());
        std::string normalbuffer_prefix = prefix;
        normalbuffer_prefix += "normalBuffer";
        std::ostringstream oss_normalBuffer;
        oss_normalBuffer << std::hex << reinterpret_cast<const void*>(value->normalBuffer);
        contents.emplace_back("XrVector3f*", normalbuffer_prefix, oss_normalBuffer.str());
        std::string confidencecount_prefix = prefix;
        confidencecount_prefix += "confidenceCount";
        std::ostringstream oss_confidenceCount;
        oss_confidenceCount << "0x" << std::hex << (value->confidenceCount);
        contents.emplace_back("uint32_t", confidencecount_prefix, oss_confidenceCount.str());
        std::string confidencebuffer_prefix = prefix;
        confidencebuffer_prefix += "confidenceBuffer";
        std::ostringstream oss_confidenceBuffer;
        oss_confidenceBuffer << std::setprecision(32) << (value->confidenceBuffer);
        contents.emplace_back("float*", confidencebuffer_prefix, oss_confidenceBuffer.str());
        return true;
    } catch(...) {
    }
    return false;
}